

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::Action::Action(Action *this,ActionType type,Location *loc)

{
  Location local_40;
  Location *local_20;
  Location *loc_local;
  Action *pAStack_10;
  ActionType type_local;
  Action *this_local;
  
  this->_vptr_Action = (_func_int **)&PTR__Action_0049e250;
  (this->loc).filename.data_ = (loc->filename).data_;
  (this->loc).filename.size_ = (loc->filename).size_;
  (this->loc).field_1.field_1.offset = (loc->field_1).field_1.offset;
  *(undefined8 *)((long)&(this->loc).field_1 + 8) = *(undefined8 *)((long)&loc->field_1 + 8);
  local_20 = loc;
  loc_local._4_4_ = type;
  pAStack_10 = this;
  Location::Location(&local_40);
  Var::Var(&this->module_var,0xffffffff,&local_40);
  std::__cxx11::string::string((string *)&this->name);
  this->type_ = loc_local._4_4_;
  return;
}

Assistant:

explicit Action(ActionType type, const Location& loc = Location())
      : loc(loc), type_(type) {}